

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O2

void __thiscall EDCircles::EDCircles(EDCircles *this,Mat *srcImage)

{
  double dVar1;
  double dVar2;
  pointer pvVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  Circle *pCVar8;
  int *piVar9;
  BufferManager *pBVar10;
  ulong uVar11;
  Info *pIVar12;
  EDArcs *pEVar13;
  pointer *ppPVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  int i;
  long lVar18;
  long lVar19;
  int iVar20;
  double *pr;
  int i_1;
  long lVar21;
  EllipseEquation *pEVar22;
  double *pdVar23;
  EDCircles *this_00;
  uint uVar24;
  ulong uVar25;
  bool bVar26;
  double dVar27;
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined4 uVar31;
  undefined4 uVar32;
  double dVar33;
  double yc;
  double circleFitError;
  double r;
  int *local_198;
  double major;
  vector<LineSegment,_std::allocator<LineSegment>_> lines;
  double xc;
  Mat *local_150;
  Size local_148;
  double local_140;
  double local_138;
  double dStack_130;
  double local_128;
  double dStack_120;
  Mat *local_118;
  double minor;
  EllipseEquation eq;
  _Vector_base<LineSegment,_std::allocator<LineSegment>_> local_d0;
  double local_b8;
  double dStack_b0;
  undefined1 local_a8 [16];
  undefined8 local_98;
  Mat local_90 [96];
  
  cv::Mat::Mat(local_90,srcImage);
  EDPF::EDPF(&this->super_EDPF,local_90);
  cv::Mat::~Mat(local_90);
  this->noCircles1 = 0;
  (this->circles).super__Vector_base<mCircle,_std::allocator<mCircle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->circles).super__Vector_base<mCircle,_std::allocator<mCircle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->circles).super__Vector_base<mCircle,_std::allocator<mCircle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ellipses).super__Vector_base<mEllipse,_std::allocator<mEllipse>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ellipses).super__Vector_base<mEllipse,_std::allocator<mEllipse>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ellipses).super__Vector_base<mEllipse,_std::allocator<mEllipse>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar15 = (this->super_EDPF).super_ED.height + (this->super_EDPF).super_ED.width;
  uVar25 = (ulong)(iVar15 * 8);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar25;
  uVar11 = SUB168(auVar30 * ZEXT816(0x98),0);
  if (SUB168(auVar30 * ZEXT816(0x98),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  pCVar8 = (Circle *)operator_new__(uVar11);
  local_118 = srcImage;
  if (iVar15 != 0) {
    pEVar22 = &pCVar8->eq;
    lVar16 = uVar25 * 0x98;
    do {
      EllipseEquation::EllipseEquation(pEVar22);
      pEVar22 = (EllipseEquation *)((long)(pEVar22 + 2) + 0x28);
      lVar16 = lVar16 + -0x98;
    } while (lVar16 != 0);
  }
  local_198 = &this->noCircles1;
  this->circles1 = pCVar8;
  pvVar3 = (this->super_EDPF).super_ED.segmentPoints.
           super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar16 = ((long)(this->super_EDPF).super_ED.segmentPoints.
                  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3) / 0x18;
  ppPVar14 = (pointer *)
             ((long)&(pvVar3->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                     )._M_impl.super__Vector_impl_data + 8);
  iVar15 = 0;
  while (bVar26 = lVar16 != 0, lVar16 = lVar16 + -1, bVar26) {
    iVar15 = iVar15 + (int)((ulong)((long)*ppPVar14 -
                                   (long)((_Vector_impl_data *)(ppPVar14 + -1))->_M_start) >> 3);
    ppPVar14 = ppPVar14 + 3;
  }
  lVar16 = (long)(this->super_EDPF).super_ED.segmentNos;
  uVar11 = lVar16 * 4 + 4;
  if (lVar16 < -1) {
    uVar11 = 0xffffffffffffffff;
  }
  piVar9 = (int *)operator_new__(uVar11);
  this->segmentStartLines = piVar9;
  pBVar10 = (BufferManager *)operator_new(0x18);
  BufferManager::BufferManager(pBVar10,iVar15 << 3);
  this->bm = pBVar10;
  lines.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lines.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  lines.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar16 = 0;
  do {
    lVar19 = (long)(this->super_EDPF).super_ED.segmentNos;
    uVar11 = ((long)lines.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)lines.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x48;
    piVar9 = this->segmentStartLines;
    iVar15 = (int)uVar11;
    if (lVar19 <= lVar16) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar11;
      piVar9[lVar19] = iVar15;
      uVar11 = SUB168(auVar4 * ZEXT816(0x18),0);
      if (SUB168(auVar4 * ZEXT816(0x18),8) != 0) {
        uVar11 = 0xffffffffffffffff;
      }
      pIVar12 = (Info *)operator_new__(uVar11);
      this->info = pIVar12;
      lVar16 = 0;
      while (lVar19 = lVar16, lVar19 < (this->super_EDPF).super_ED.segmentNos) {
        lVar18 = (long)piVar9[lVar19];
        lVar21 = lVar18 * 0x18 + 0x10;
        lVar17 = lVar18 * 0x48;
        while( true ) {
          lVar16 = lVar19 + 1;
          if (piVar9[lVar19 + 1] <= lVar18) break;
          lVar16 = lVar17 + 0x48;
          if ((int)lVar18 == piVar9[lVar19 + 1] + -1) {
            lVar16 = (long)piVar9[lVar19] * 0x48;
          }
          dVar28 = *(double *)
                    ((long)&(lines.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>.
                             _M_impl.super__Vector_impl_data._M_start)->ex + lVar17);
          dVar27 = *(double *)
                    ((long)&(lines.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>.
                             _M_impl.super__Vector_impl_data._M_start)->ey + lVar17);
          dVar1 = *(double *)
                   ((long)&(lines.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>.
                            _M_impl.super__Vector_impl_data._M_start)->sx + lVar16);
          dVar2 = *(double *)
                   ((long)&(lines.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>.
                            _M_impl.super__Vector_impl_data._M_start)->sy + lVar16);
          dVar7 = dVar28 - dVar1;
          dVar33 = dVar27 - dVar2;
          if (15.0 <= SQRT(dVar7 * dVar7 + dVar33 * dVar33)) {
            *(undefined8 *)((long)pIVar12 + lVar21 + -8) = 0x4024000000000000;
            *(undefined4 *)((long)pIVar12 + lVar21 + -0x10) = 2;
            *(undefined1 *)((long)&pIVar12->sign + lVar21) = 0;
          }
          else {
            local_138 = dVar28 - *(double *)
                                  ((long)&(lines.
                                           super__Vector_base<LineSegment,_std::allocator<LineSegment>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->sx + lVar17);
            dStack_130 = *(double *)
                          ((long)&(lines.
                                   super__Vector_base<LineSegment,_std::allocator<LineSegment>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->ex + lVar16) - dVar1;
            local_128 = dVar27 - *(double *)
                                  ((long)&(lines.
                                           super__Vector_base<LineSegment,_std::allocator<LineSegment>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->sy + lVar17);
            dStack_120 = *(double *)
                          ((long)&(lines.
                                   super__Vector_base<LineSegment,_std::allocator<LineSegment>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->ey + lVar16) - dVar2;
            auVar29._0_8_ = local_128 * local_128;
            auVar29._8_8_ = dStack_120 * dStack_120;
            dVar28 = dStack_130 * dStack_130 + auVar29._8_8_;
            auVar6._8_4_ = SUB84(dVar28,0);
            auVar6._0_8_ = local_138 * local_138 + auVar29._0_8_;
            auVar6._12_4_ = (int)((ulong)dVar28 >> 0x20);
            auVar30 = sqrtpd(auVar29,auVar6);
            local_a8._8_4_ = SUB84(dStack_120,0);
            local_a8._0_8_ = dStack_120;
            local_a8._12_4_ = (int)((ulong)dStack_120 >> 0x20);
            dVar28 = (local_138 * dStack_130 + local_128 * dStack_120) /
                     (auVar30._8_8_ * auVar30._0_8_);
            dVar27 = 1.0;
            if ((dVar28 <= 1.0) && (dVar27 = dVar28, dVar28 < -1.0)) {
              dVar27 = -1.0;
            }
            local_b8 = dStack_130;
            dStack_b0 = dStack_130;
            dVar28 = acos(dVar27);
            pIVar12 = this->info;
            *(double *)((long)pIVar12 + lVar21 + -8) = dVar28;
            *(uint *)((long)pIVar12 + lVar21 + -0x10) =
                 -(uint)(local_138 * (double)local_a8._0_8_ - local_b8 * local_128 < 0.0) | 1;
            *(undefined1 *)((long)&pIVar12->sign + lVar21) = 0;
            piVar9 = this->segmentStartLines;
          }
          lVar18 = lVar18 + 1;
          lVar21 = lVar21 + 0x18;
          lVar17 = lVar17 + 0x48;
        }
      }
      uVar11 = ((long)lines.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)lines.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
                     super__Vector_impl_data._M_start) / 0x48;
      iVar15 = *local_198;
      pEVar13 = (EDArcs *)operator_new(0x10);
      iVar15 = (int)((long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff) / 3) +
               iVar15 * 2;
      EDArcs::EDArcs(pEVar13,iVar15);
      this->edarcs1 = pEVar13;
      std::vector<LineSegment,_std::allocator<LineSegment>_>::vector
                ((vector<LineSegment,_std::allocator<LineSegment>_> *)&local_d0,&lines);
      DetectArcs(this,(vector<LineSegment,_std::allocator<LineSegment>_> *)&local_d0);
      std::_Vector_base<LineSegment,_std::allocator<LineSegment>_>::~_Vector_base(&local_d0);
      pEVar13 = (EDArcs *)operator_new(0x10);
      EDArcs::EDArcs(pEVar13,iVar15);
      this->edarcs2 = pEVar13;
      JoinArcs1(this);
      pEVar13 = (EDArcs *)operator_new(0x10);
      EDArcs::EDArcs(pEVar13,iVar15);
      this->edarcs3 = pEVar13;
      JoinArcs2(this);
      pEVar13 = (EDArcs *)operator_new(0x10);
      EDArcs::EDArcs(pEVar13,iVar15);
      this->edarcs4 = pEVar13;
      JoinArcs3(this);
      GenerateCandidateCircles(this);
      this->noCircles2 = 0;
      uVar25 = (ulong)iVar15;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar25;
      uVar11 = SUB168(auVar5 * ZEXT816(0x98),0);
      if (SUB168(auVar5 * ZEXT816(0x98),8) != 0) {
        uVar11 = 0xffffffffffffffff;
      }
      pCVar8 = (Circle *)operator_new__(uVar11);
      if (iVar15 != 0) {
        pEVar22 = &pCVar8->eq;
        lVar16 = uVar25 * 0x98;
        do {
          EllipseEquation::EllipseEquation(pEVar22);
          pEVar22 = (EllipseEquation *)((long)(pEVar22 + 2) + 0x28);
          lVar16 = lVar16 + -0x98;
        } while (lVar16 != 0);
      }
      this->circles2 = pCVar8;
      eq.coeff[2] = 0.0;
      eq.coeff[0] = (double)CONCAT44(eq.coeff[0]._4_4_,0x1010000);
      local_148.width = 0;
      local_148.height = 0;
      eq.coeff[1] = (double)local_118;
      local_150 = &(this->super_EDPF).super_ED.smoothImage;
      xc = (double)CONCAT44(xc._4_4_,0x2010000);
      local_98 = 0;
      cv::GaussianBlur(0x3fe0000000000000,0);
      ValidateCircles(this);
      this->noCircles3 = 0;
      pCVar8 = (Circle *)operator_new__(uVar11);
      if (iVar15 != 0) {
        pEVar22 = &pCVar8->eq;
        lVar16 = uVar25 * 0x98;
        do {
          EllipseEquation::EllipseEquation(pEVar22);
          pEVar22 = (EllipseEquation *)((long)(pEVar22 + 2) + 0x28);
          lVar16 = lVar16 + -0x98;
        } while (lVar16 != 0);
      }
      this->circles3 = pCVar8;
      JoinCircles(this);
      this->noEllipses = 0;
      this->noCircles = 0;
      uVar24 = this->noCircles3;
      lVar16 = 0;
      uVar11 = 0;
      if (0 < (int)uVar24) {
        uVar11 = (ulong)uVar24;
      }
      iVar15 = 0;
      iVar20 = 0;
      for (; uVar11 * 0x98 - lVar16 != 0; lVar16 = lVar16 + 0x98) {
        if (*(char *)((long)(&this->circles3->eq + 1) + lVar16 + 8) == '\x01') {
          iVar15 = iVar15 + 1;
          this->noEllipses = iVar15;
        }
        else {
          iVar20 = iVar20 + 1;
          this->noCircles = iVar20;
        }
      }
      lVar16 = 0;
      for (lVar19 = 0; lVar19 < (int)uVar24; lVar19 = lVar19 + 1) {
        pCVar8 = this->circles3;
        if (*(char *)((long)(&pCVar8->eq + 1) + lVar16 + 8) == '\x01') {
          eq.coeff[6] = *(double *)((long)(pCVar8->eq).coeff + lVar16 + 0x30);
          pdVar23 = (double *)((long)(pCVar8->eq).coeff + lVar16);
          eq.coeff[0] = *pdVar23;
          eq.coeff[1] = pdVar23[1];
          pdVar23 = (double *)((long)(pCVar8->eq).coeff + lVar16 + 0x10);
          eq.coeff[2] = *pdVar23;
          eq.coeff[3] = pdVar23[1];
          pdVar23 = (double *)((long)(pCVar8->eq).coeff + lVar16 + 0x20);
          eq.coeff[4] = *pdVar23;
          eq.coeff[5] = pdVar23[1];
          local_140 = ComputeEllipseCenterAndAxisLengths(&eq,&yc,&r,&circleFitError,&major);
          xc = yc;
          local_150 = (Mat *)r;
          local_148.height = (int)ROUND(major);
          local_148.width = (int)ROUND(circleFitError);
          std::vector<mEllipse,_std::allocator<mEllipse>_>::emplace_back<mEllipse>
                    (&this->ellipses,(mEllipse *)&xc);
        }
        else {
          eq.coeff[2] = *(double *)((long)(pCVar8->eq).coeff + lVar16 + -0x30);
          pdVar23 = (double *)((long)(pCVar8->eq).coeff + lVar16 + -0x40);
          eq.coeff[0] = *pdVar23;
          eq.coeff[1] = pdVar23[1];
          std::vector<mCircle,_std::allocator<mCircle>_>::emplace_back<mCircle>
                    (&this->circles,(mCircle *)&eq);
        }
        uVar24 = this->noCircles3;
        lVar16 = lVar16 + 0x98;
      }
      pEVar13 = this->edarcs1;
      if (pEVar13 != (EDArcs *)0x0) {
        EDArcs::~EDArcs(pEVar13);
      }
      operator_delete(pEVar13);
      pEVar13 = this->edarcs2;
      if (pEVar13 != (EDArcs *)0x0) {
        EDArcs::~EDArcs(pEVar13);
      }
      operator_delete(pEVar13);
      pEVar13 = this->edarcs3;
      if (pEVar13 != (EDArcs *)0x0) {
        EDArcs::~EDArcs(pEVar13);
      }
      operator_delete(pEVar13);
      pEVar13 = this->edarcs4;
      if (pEVar13 != (EDArcs *)0x0) {
        EDArcs::~EDArcs(pEVar13);
      }
      operator_delete(pEVar13);
      if (this->circles1 != (Circle *)0x0) {
        operator_delete__(this->circles1);
      }
      if (this->circles2 != (Circle *)0x0) {
        operator_delete__(this->circles2);
      }
      if (this->circles3 != (Circle *)0x0) {
        operator_delete__(this->circles3);
      }
      pBVar10 = this->bm;
      if (pBVar10 != (BufferManager *)0x0) {
        BufferManager::~BufferManager(pBVar10);
      }
      operator_delete(pBVar10);
      if (this->segmentStartLines != (int *)0x0) {
        operator_delete__(this->segmentStartLines);
      }
      if (this->info != (Info *)0x0) {
        operator_delete__(this->info);
      }
      std::_Vector_base<LineSegment,_std::allocator<LineSegment>_>::~_Vector_base
                (&lines.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>);
      return;
    }
    piVar9[lVar16] = iVar15;
    pvVar3 = (this->super_EDPF).super_ED.segmentPoints.
             super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar19 = *(long *)&pvVar3[lVar16].
                       super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                       _M_impl.super__Vector_impl_data;
    uVar11 = (long)*(pointer *)
                    ((long)&pvVar3[lVar16].
                            super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                            _M_impl.super__Vector_impl_data + 8) - lVar19 >> 3;
    uVar24 = (uint)uVar11;
    if (0xb < (int)uVar24) {
      pBVar10 = this->bm;
      this_00 = (EDCircles *)(pBVar10->x + pBVar10->index);
      pdVar23 = pBVar10->y + pBVar10->index;
      for (uVar25 = 0; (uVar24 & 0x7fffffff) != uVar25; uVar25 = uVar25 + 1) {
        *(double *)(&(this_00->super_EDPF).super_ED.width + uVar25 * 2) =
             (double)*(int *)(lVar19 + uVar25 * 8);
        pdVar23[uVar25] = (double)*(int *)(lVar19 + 4 + uVar25 * 8);
      }
      if (0x17 < (int)uVar24) {
        dVar27 = *(double *)&(this_00->super_EDPF).super_ED -
                 *(double *)(&(this_00->super_EDPF).super_ED.width + (ulong)(uVar24 - 1) * 2);
        dVar28 = ((double)(int)uVar24 / 6.283185307179586) * 0.25;
        if (dVar28 <= 3.0) {
          dVar28 = 3.0;
        }
        if (SQRT(dVar27 * dVar27 +
                 (*pdVar23 - pdVar23[uVar24 - 1]) * (*pdVar23 - pdVar23[uVar24 - 1])) <= dVar28) {
          circleFitError = 10000000000.0;
          pr = &r;
          CircleFit((double *)this_00,pdVar23,uVar24,&xc,&yc,pr,&circleFitError);
          iVar15 = (int)pr;
          EllipseEquation::EllipseEquation(&eq);
          local_138 = circleFitError;
          uVar31 = 0x20000000;
          uVar32 = 0x4202a05f;
          if (1.5 < circleFitError) {
            bVar26 = EllipseFit(this_00,pdVar23,(double *)(uVar11 & 0xffffffff),(int)&eq,
                                (EllipseEquation *)0x1,iVar15);
            uVar31 = 0x20000000;
            uVar32 = 0x4202a05f;
            if (bVar26) {
              dVar28 = ComputeEllipseError(&eq,(double *)this_00,pdVar23,uVar24);
              uVar31 = SUB84(dVar28,0);
              uVar32 = (undefined4)((ulong)dVar28 >> 0x20);
            }
          }
          if (local_138 <= 1.5) {
            addCircle(this->circles1,local_198,xc,yc,r,local_138,(double *)this_00,pdVar23,uVar24);
          }
          else {
            if (1.5 < (double)CONCAT44(uVar32,uVar31)) goto LAB_00109b3f;
            local_128 = (double)CONCAT44(uVar32,uVar31);
            ComputeEllipseCenterAndAxisLengths(&eq,&xc,&yc,&major,&minor);
            uVar32 = SUB84(major,0);
            uVar31 = (undefined4)((ulong)major >> 0x20);
            dVar28 = minor;
            if (minor <= major) {
              uVar32 = SUB84(minor,0);
              uVar31 = (undefined4)((ulong)minor >> 0x20);
              dVar28 = major;
            }
            if ((double)CONCAT44(uVar31,uVar32) * 8.0 <= dVar28) goto LAB_00109b5e;
            addCircle(this->circles1,local_198,xc,yc,r,local_138,&eq,local_128,(double *)this_00,
                      pdVar23,uVar24);
          }
          piVar9 = &this->bm->index;
          *piVar9 = *piVar9 + uVar24;
          goto LAB_00109b5e;
        }
      }
LAB_00109b3f:
      EDLines::SplitSegment2Lines((double *)this_00,pdVar23,uVar24,(int)lVar16,&lines,6,1.0);
    }
LAB_00109b5e:
    lVar16 = lVar16 + 1;
  } while( true );
}

Assistant:

EDCircles::EDCircles(Mat srcImage)
	: EDPF(srcImage)
{
	// Arcs & circles to be detected
	// If the end-points of the segment is very close to each other, 
	// then directly fit a circle/ellipse instread of line fitting
	noCircles1 = 0;
	circles1 = new Circle[(width + height) * 8];

	// ----------------------------------- DETECT LINES ---------------------------------
	int bufferSize = 0;
	for (int i = 0; i < segmentPoints.size(); i++) 
		bufferSize += (int)segmentPoints[i].size();

	// Compute the starting line number for each segment
	segmentStartLines = new int[segmentNos + 1];

	bm = new BufferManager(bufferSize * 8);
	vector<LineSegment> lines;


#define CIRCLE_MIN_LINE_LEN 6

	for (int i = 0; i < segmentNos; i++) {

		// Make note of the starting line number for this segment
		segmentStartLines[i] = (int)lines.size();

		int noPixels = (int)segmentPoints[i].size();

		if (noPixels < 2 * CIRCLE_MIN_LINE_LEN) 
			continue;

		double *x = bm->getX();
		double *y = bm->getY();

		for (int j = 0; j<noPixels; j++) {
			x[j] = segmentPoints[i][j].x;
			y[j] = segmentPoints[i][j].y;
		} //end-for

		  // If the segment is reasonably long, then see if the segment traverses the boundary of a closed shape
		if (noPixels >= 4 * CIRCLE_MIN_LINE_LEN) {
			// If the end-points of the segment is close to each other, then assume a circular/elliptic structure
			double dx = x[0] - x[noPixels - 1];
			double dy = y[0] - y[noPixels - 1];
			double d = sqrt(dx*dx + dy*dy);
			double r = noPixels / TWOPI;      // Assume a complete circle

			double maxDistanceBetweenEndPoints = MAX(3, r / 4);

			// If almost closed loop, then try to fit a circle/ellipse
			if (d <= maxDistanceBetweenEndPoints) {
				double xc, yc, r, circleFitError = 1e10;

				CircleFit(x, y, noPixels, &xc, &yc, &r, &circleFitError);

				EllipseEquation eq;
				double ellipseFitError = 1e10;

				if (circleFitError > LONG_ARC_ERROR) {
					// Try fitting an ellipse
					if (EllipseFit(x, y, noPixels, &eq)) 
						ellipseFitError = ComputeEllipseError(&eq, x, y, noPixels);
				} //end-if

				if (circleFitError <= LONG_ARC_ERROR) {
					addCircle(circles1, noCircles1, xc ,yc, r, circleFitError, x, y, noPixels);
					bm->move(noPixels);
					continue;

				}
				else if (ellipseFitError <= ELLIPSE_ERROR) {
					double major, minor;
					ComputeEllipseCenterAndAxisLengths(&eq, &xc, &yc, &major, &minor);

					// Assume major is longer. Otherwise, swap
					if (minor > major) { double tmp = major; major = minor; minor = tmp; }

					if (major < 8 * minor) {
						addCircle(circles1, noCircles1,xc, yc, r, circleFitError, &eq, ellipseFitError, x, y, noPixels);
						bm->move(noPixels);
					} //end-if

					continue;
				} //end-else
			} //end-if 
		} //end-if
		
		// Otherwise, split to lines
		EDLines::SplitSegment2Lines(x, y, noPixels, i, lines);
	}

	segmentStartLines[segmentNos] = (int)lines.size();

	// ------------------------------- DETECT ARCS ---------------------------------

	info = new Info[lines.size()];

	// Compute the angle information for each line segment
	for (int i = 0; i<segmentNos; i++) {
		for (int j = segmentStartLines[i]; j<segmentStartLines[i + 1]; j++) {
			LineSegment *l1 = &lines[j];
			LineSegment *l2;

			if (j == segmentStartLines[i + 1] - 1) l2 = &lines[segmentStartLines[i]];
			else                               l2 = &lines[j + 1];

#if 1
			// If the end points of the lines are far from each other, then stop at this line
			double dx = l1->ex - l2->sx;
			double dy = l1->ey - l2->sy;
			double d = sqrt(dx*dx + dy*dy);
			if (d >= 15) { info[j].angle = 10; info[j].sign = 2; info[j].taken = false; continue; }
#endif

			// Compute the angle between the lines & their turn direction
			double v1x = l1->ex - l1->sx;
			double v1y = l1->ey - l1->sy;
			double v1Len = sqrt(v1x*v1x + v1y*v1y);

			double v2x = l2->ex - l2->sx;
			double v2y = l2->ey - l2->sy;
			double v2Len = sqrt(v2x*v2x + v2y*v2y);

			double dotProduct = (v1x*v2x + v1y*v2y) / (v1Len*v2Len);
			if (dotProduct > 1.0) dotProduct = 1.0;
			else if (dotProduct < -1.0) dotProduct = -1.0;

			info[j].angle = acos(dotProduct);
			info[j].sign = (v1x*v2y - v2x*v1y) >= 0 ? 1 : -1;  // compute cross product
			info[j].taken = false;
		} //end-for
	} //end-for

	// This is how much space we will allocate for circles buffers
	int maxNoOfCircles = (int)lines.size() / 3 + noCircles1 * 2;

	edarcs1 = new EDArcs(maxNoOfCircles);
	DetectArcs(lines);    // Detect all arcs

	// Try to join arcs that are almost perfectly circular. 
	// Use the distance between the arc end-points as a metric in choosing in choosing arcs to join
	edarcs2 = new EDArcs(maxNoOfCircles);
	JoinArcs1();

	// Try to join arcs that belong to the same segment
	edarcs3 = new EDArcs(maxNoOfCircles);
	JoinArcs2();

	// Try to combine arcs that belong to different segments
	edarcs4 = new EDArcs(maxNoOfCircles);     // The remaining arcs
	JoinArcs3();

	// Finally, go over the arcs & circles, and generate candidate circles
	GenerateCandidateCircles();

	//----------------------------- VALIDATE CIRCLES --------------------------
	noCircles2 = 0;
	circles2 = new Circle[maxNoOfCircles];
	GaussianBlur(srcImage, smoothImage, Size(), 0.50); // calculate kernel from sigma;

	ValidateCircles();

	//----------------------------- JOIN CIRCLES --------------------------
	noCircles3 = 0;
	circles3 = new Circle[maxNoOfCircles];
	JoinCircles();

	noCircles = 0;
	noEllipses = 0;
	for (int i = 0; i < noCircles3; i++) {
		if (circles3[i].isEllipse)
			noEllipses++;
		else
			noCircles++;
	}

	for (int i = 0; i<noCircles3; i++) {
		if (circles3[i].isEllipse) {
			EllipseEquation eq = circles3[i].eq;
			double xc;
			double yc;
			double a;
			double b;
			double theta = ComputeEllipseCenterAndAxisLengths(&eq, &xc, &yc, &a, &b);
			ellipses.push_back(mEllipse(Point2d(xc, yc), Size2d(a, b), theta));

		}
		else {
			double r = circles3[i].r;
			double xc = circles3[i].xc;
			double yc = circles3[i].yc;

			circles.push_back(mCircle(Point2d(xc, yc), r));
			
		} //end-else
	} //end-for


	// clean up
	delete edarcs1;
	delete edarcs2;
	delete edarcs3;
	delete edarcs4;

	delete[] circles1;
	delete[] circles2;
	delete[] circles3;

	delete bm;
	delete[] segmentStartLines;
	delete[] info;
}